

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemIdentifier.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::SystemIdentifier::Decode(SystemIdentifier *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (5 < KVar1) {
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16SystemType);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16SystemName);
    KDataStream::Read(stream,&this->m_ui8SystemMode);
    KDataStream::Read(stream,&(this->field_3).m_ui8ChangeOptions);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void SystemIdentifier::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < SYSTEM_IDENTIFER_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui16SystemType
           >> m_ui16SystemName
           >> m_ui8SystemMode
           >> m_ui8ChangeOptions;
}